

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_GiveToSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  int iVar5;
  char *__assertion;
  VMReturn *in_R9;
  AActor *this;
  int in_stack_ffffffffffffff88;
  int local_6c;
  TThinkerIterator<AActor> it;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003e0aa4;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e0a94:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e0aa4:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x998,
                  "int AF_AActor_A_GiveToSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this != (AActor *)0x0) {
      bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
      if (!bVar1) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003e0aa4;
      }
      goto LAB_003e09c6;
    }
  }
  else if (this != (AActor *)0x0) goto LAB_003e0a94;
  this = (AActor *)0x0;
LAB_003e09c6:
  TThinkerIterator<AActor>::TThinkerIterator(&it,0x80);
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)&this->master);
  local_6c = 0;
  if (pAVar2 != (AActor *)0x0) {
    local_6c = 0;
    while (pAVar2 = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false),
          pAVar2 != (AActor *)0x0) {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->master);
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)&pAVar2->master);
      if ((pAVar2 != this) && (pAVar4 == pAVar3)) {
        bVar1 = DoGiveInventory(pAVar2,true,param,defaultparam,numparam,in_R9,
                                in_stack_ffffffffffffff88);
        local_6c = local_6c + (uint)bVar1;
      }
    }
  }
  iVar5 = 0;
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9a8,
                    "int AF_AActor_A_GiveToSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar5 = 1;
    VMReturn::SetInt(ret,local_6c);
  }
  return iVar5;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveToSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<AActor> it;
	AActor *mo;
	int count = 0;

	if (self->master != NULL)
	{
		while ((mo = it.Next()))
		{
			if (mo->master == self->master && mo != self)
			{
				count += DoGiveInventory(mo, true, VM_ARGS_NAMES);
			}
		}
	}
	ACTION_RETURN_INT(count);
}